

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSchemaValidateLengthFacetWhtsp(void)

{
  int iVar1;
  xmlSchemaValType val_00;
  xmlSchemaWhitespaceValueType val_01;
  int iVar2;
  xmlChar *val_02;
  unsigned_long *val_03;
  uint local_64;
  int n_ws;
  xmlSchemaWhitespaceValueType ws;
  int n_length;
  unsigned_long *length;
  int n_val;
  xmlSchemaValPtr val;
  int n_value;
  xmlChar *value;
  int n_valType;
  xmlSchemaValType valType;
  int n_facet;
  xmlSchemaFacetPtr facet;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (n_valType = 0; n_valType < 1; n_valType = n_valType + 1) {
    for (value._4_4_ = 0; (int)value._4_4_ < 4; value._4_4_ = value._4_4_ + 1) {
      for (val._4_4_ = 0; (int)val._4_4_ < 5; val._4_4_ = val._4_4_ + 1) {
        for (length._4_4_ = 0; (int)length._4_4_ < 1; length._4_4_ = length._4_4_ + 1) {
          for (n_ws = 0; n_ws < 2; n_ws = n_ws + 1) {
            for (local_64 = 0; (int)local_64 < 4; local_64 = local_64 + 1) {
              iVar1 = xmlMemBlocks();
              val_00 = gen_xmlSchemaValType(value._4_4_,1);
              val_02 = gen_const_xmlChar_ptr(val._4_4_,2);
              val_03 = gen_unsigned_long_ptr(n_ws,4);
              val_01 = gen_xmlSchemaWhitespaceValueType(local_64,5);
              iVar2 = xmlSchemaValidateLengthFacetWhtsp(0,val_00,val_02,0,val_03,val_01);
              desret_int(iVar2);
              call_tests = call_tests + 1;
              des_xmlSchemaValType(value._4_4_,val_00,1);
              des_const_xmlChar_ptr(val._4_4_,val_02,2);
              des_unsigned_long_ptr(n_ws,val_03,4);
              des_xmlSchemaWhitespaceValueType(local_64,val_01,5);
              xmlResetLastError();
              iVar2 = xmlMemBlocks();
              if (iVar1 != iVar2) {
                iVar2 = xmlMemBlocks();
                printf("Leak of %d blocks found in xmlSchemaValidateLengthFacetWhtsp",
                       (ulong)(uint)(iVar2 - iVar1));
                ret_val = ret_val + 1;
                printf(" %d",(ulong)(uint)n_valType);
                printf(" %d",(ulong)value._4_4_);
                printf(" %d",(ulong)val._4_4_);
                printf(" %d",(ulong)length._4_4_);
                printf(" %d",(ulong)(uint)n_ws);
                printf(" %d",(ulong)local_64);
                printf("\n");
              }
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlSchemaValidateLengthFacetWhtsp(void) {
    int test_ret = 0;

#if defined(LIBXML_SCHEMAS_ENABLED)
    int mem_base;
    int ret_val;
    xmlSchemaFacetPtr facet; /* the facet to check */
    int n_facet;
    xmlSchemaValType valType; /* the built-in type */
    int n_valType;
    const xmlChar * value; /* the lexical repr. of the value to be validated */
    int n_value;
    xmlSchemaValPtr val; /* the precomputed value */
    int n_val;
    unsigned long * length; /* the actual length of the value */
    int n_length;
    xmlSchemaWhitespaceValueType ws; /* the whitespace type of the value */
    int n_ws;

    for (n_facet = 0;n_facet < gen_nb_xmlSchemaFacetPtr;n_facet++) {
    for (n_valType = 0;n_valType < gen_nb_xmlSchemaValType;n_valType++) {
    for (n_value = 0;n_value < gen_nb_const_xmlChar_ptr;n_value++) {
    for (n_val = 0;n_val < gen_nb_xmlSchemaValPtr;n_val++) {
    for (n_length = 0;n_length < gen_nb_unsigned_long_ptr;n_length++) {
    for (n_ws = 0;n_ws < gen_nb_xmlSchemaWhitespaceValueType;n_ws++) {
        mem_base = xmlMemBlocks();
        facet = gen_xmlSchemaFacetPtr(n_facet, 0);
        valType = gen_xmlSchemaValType(n_valType, 1);
        value = gen_const_xmlChar_ptr(n_value, 2);
        val = gen_xmlSchemaValPtr(n_val, 3);
        length = gen_unsigned_long_ptr(n_length, 4);
        ws = gen_xmlSchemaWhitespaceValueType(n_ws, 5);

        ret_val = xmlSchemaValidateLengthFacetWhtsp(facet, valType, value, val, length, ws);
        desret_int(ret_val);
        call_tests++;
        des_xmlSchemaFacetPtr(n_facet, facet, 0);
        des_xmlSchemaValType(n_valType, valType, 1);
        des_const_xmlChar_ptr(n_value, value, 2);
        des_xmlSchemaValPtr(n_val, val, 3);
        des_unsigned_long_ptr(n_length, length, 4);
        des_xmlSchemaWhitespaceValueType(n_ws, ws, 5);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSchemaValidateLengthFacetWhtsp",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_facet);
            printf(" %d", n_valType);
            printf(" %d", n_value);
            printf(" %d", n_val);
            printf(" %d", n_length);
            printf(" %d", n_ws);
            printf("\n");
        }
    }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}